

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O1

UdpFieldBaseSyntax * __thiscall
slang::parsing::Parser::parseUdpField
          (Parser *this,bool required,bool isInput,bool isSequential,bool *sawTransition)

{
  uint uVar1;
  undefined1 auVar2 [16];
  Parser *pPVar3;
  Token TVar4;
  bool bVar5;
  uint uVar6;
  SourceLocation SVar7;
  UdpEdgeFieldSyntax *this_00;
  long lVar8;
  Diagnostic *pDVar9;
  UdpSimpleFieldSyntax *pUVar10;
  size_t sVar11;
  DiagCode code;
  DiagCode code_00;
  int iVar12;
  long lVar13;
  Token openParen;
  Token closeParen;
  string_view sVar14;
  string_view sVar15;
  SourceRange SVar16;
  char chars [2];
  bool error_1;
  bool error;
  Token next;
  Token second;
  anon_class_24_3_e8089fb6 nextSymbol;
  Token tok;
  anon_class_32_4_e325f0aa checkTransition;
  bool local_fd;
  char local_fc [3];
  bool local_f9;
  Parser *local_f8;
  bool local_e9;
  undefined1 local_e8 [16];
  Token local_d8;
  Token local_c8;
  Token local_b0;
  UdpEdgeFieldSyntax *local_a0;
  long local_98;
  anon_class_24_3_e8089fb6 local_90;
  Token local_78;
  Token local_60;
  anon_class_32_4_e325f0aa local_50;
  
  local_90.isInput = &local_fd;
  local_50.isSequential = &local_e9;
  local_90.checkTransition = &local_50;
  local_fd = isInput;
  local_f8 = this;
  local_e9 = isSequential;
  local_90.this = this;
  local_50.isInput = local_90.isInput;
  local_50.sawTransition = sawTransition;
  local_50.this = this;
  bVar5 = ParserBase::peek(&this->super_ParserBase,OpenParenthesis);
  pPVar3 = local_50.this;
  if (!bVar5) {
    auVar2[0xf] = 0;
    auVar2._0_15_ = local_e8._1_15_;
    local_e8 = auVar2 << 8;
    local_d8 = parseUdpField::anon_class_24_3_e8089fb6::operator()
                         (&local_90,required,false,(bool *)local_e8);
    if (local_d8.info == (Info *)0x0) {
      return (UdpFieldBaseSyntax *)0x0;
    }
    if ((local_fd == false) && (local_e8[0] == false)) {
      sVar14 = Token::rawText(&local_d8);
      if (sVar14._M_len < 2) {
        if (sVar14._M_len != 0) {
          uVar6 = tolower((int)*sVar14._M_str);
          uVar1 = (uVar6 & 0xff) - 0x66;
          if (((uVar1 < 0xd) && ((0x1501U >> (uVar1 & 0x1f) & 1) != 0)) || ((uVar6 & 0xff) == 0x2a))
          {
            SVar7 = Token::location(&local_d8);
            pDVar9 = ParserBase::addDiag(&local_f8->super_ParserBase,(DiagCode)0xaf0005,SVar7);
            Diagnostic::operator<<(pDVar9,(char)uVar6);
          }
        }
      }
      else {
        SVar16 = Token::range(&local_d8);
        ParserBase::addDiag(&local_f8->super_ParserBase,(DiagCode)0xb50005,SVar16);
      }
    }
    pUVar10 = slang::syntax::SyntaxFactory::udpSimpleField(&local_f8->factory,local_d8);
    return &pUVar10->super_UdpFieldBaseSyntax;
  }
  if (*local_50.isInput == true) {
    if (*local_50.sawTransition == true) {
      local_d8 = ParserBase::peek(&(local_50.this)->super_ParserBase);
      SVar7 = Token::location(&local_d8);
      code.subsystem = Parser;
      code.code = 0xac;
    }
    else {
      if (*local_50.isSequential != false) goto LAB_003c0289;
      local_d8 = ParserBase::peek(&(local_50.this)->super_ParserBase);
      SVar7 = Token::location(&local_d8);
      code.subsystem = Parser;
      code.code = 0xad;
    }
    ParserBase::addDiag(&pPVar3->super_ParserBase,code,SVar7);
  }
LAB_003c0289:
  pPVar3 = local_f8;
  *local_50.sawTransition = true;
  openParen = ParserBase::consume(&local_f8->super_ParserBase);
  local_f9 = false;
  local_e8 = (undefined1  [16])
             parseUdpField::anon_class_24_3_e8089fb6::operator()(&local_90,true,true,&local_f9);
  local_b0 = parseUdpField::anon_class_24_3_e8089fb6::operator()(&local_90,false,true,&local_f9);
  closeParen = ParserBase::expect(&pPVar3->super_ParserBase,CloseParenthesis);
  local_60 = closeParen;
  this_00 = slang::syntax::SyntaxFactory::udpEdgeField
                      (&pPVar3->factory,openParen,(Token)local_e8,local_b0,closeParen);
  if ((closeParen._0_4_ >> 0x10 & 1) != 0) {
    return &this_00->super_UdpFieldBaseSyntax;
  }
  if (local_fd == false) {
    SVar16 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)this_00);
    code_00.subsystem = Parser;
    code_00.code = 0xb3;
  }
  else {
    if (local_f9 != false) {
      return &this_00->super_UdpFieldBaseSyntax;
    }
    sVar14 = Token::rawText((Token *)local_e8);
    sVar15 = Token::rawText(&local_b0);
    TVar4 = local_b0;
    if (sVar15._M_len + sVar14._M_len == 2) {
      local_a0 = this_00;
      local_fc[0] = '\0';
      local_fc[1] = '\0';
      local_d8.kind = local_e8._0_2_;
      local_d8._2_1_ = local_e8[2];
      local_d8.numFlags.raw = local_e8[3];
      local_d8.rawLen = local_e8._4_4_;
      local_d8.info = (Info *)local_e8._8_8_;
      local_c8.kind = local_b0.kind;
      local_c8._2_1_ = local_b0._2_1_;
      local_c8.numFlags.raw = local_b0.numFlags.raw;
      local_c8.rawLen = local_b0.rawLen;
      local_c8.info = local_b0.info;
      iVar12 = 0;
      lVar13 = 0;
      local_b0 = TVar4;
      do {
        local_98 = lVar13;
        local_78._0_8_ = *(undefined8 *)((long)&local_d8.kind + lVar13);
        local_78.info = *(Info **)((long)&local_d8.info + lVar13);
        sVar14 = Token::rawText(&local_78);
        if (sVar14._M_len != 0) {
          lVar13 = 0;
          sVar11 = 0;
          do {
            uVar6 = tolower((int)sVar14._M_str[sVar11]);
            uVar1 = (uVar6 & 0xff) - 0x3f;
            if (((uVar1 < 0x3a) && ((0x200000800000001U >> ((ulong)uVar1 & 0x3f) & 1) != 0)) ||
               ((uVar6 & 0xff) - 0x30 < 2)) {
              lVar8 = (long)iVar12;
              iVar12 = iVar12 + 1;
              local_fc[lVar8] = (char)uVar6;
            }
            else {
              SVar7 = Token::location(&local_78);
              pDVar9 = ParserBase::addDiag(&local_f8->super_ParserBase,(DiagCode)0xae0005,
                                           (SourceLocation)((long)SVar7 + lVar13));
              Diagnostic::operator<<(pDVar9,(char)uVar6);
            }
            sVar11 = sVar11 + 1;
            lVar13 = lVar13 + 0x10000000;
          } while (sVar14._M_len != sVar11);
        }
        this_00 = local_a0;
        lVar13 = local_98 + 0x10;
      } while (lVar13 != 0x20);
      if (iVar12 != 2) {
        return &local_a0->super_UdpFieldBaseSyntax;
      }
      if (local_fc[0] != local_fc[1]) {
        return &local_a0->super_UdpFieldBaseSyntax;
      }
      if (local_fc[0] == '?') {
        return &local_a0->super_UdpFieldBaseSyntax;
      }
      if (local_fc[0] == 'b') {
        return &local_a0->super_UdpFieldBaseSyntax;
      }
      SVar16 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_a0);
      code_00.subsystem = Parser;
      code_00.code = 0xb6;
    }
    else {
      SVar16 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)this_00);
      code_00.subsystem = Parser;
      code_00.code = 0xb7;
    }
  }
  ParserBase::addDiag(&local_f8->super_ParserBase,code_00,SVar16);
  return &this_00->super_UdpFieldBaseSyntax;
}

Assistant:

UdpFieldBaseSyntax* Parser::parseUdpField(bool required, bool isInput, bool isSequential,
                                          bool& sawTransition) {
    auto checkTransition = [&](std::optional<SourceLocation> loc = {}) {
        if (isInput) {
            if (sawTransition) {
                if (!loc)
                    loc = peek().location();
                addDiag(diag::UdpDupTransition, *loc);
            }
            else if (!isSequential) {
                if (!loc)
                    loc = peek().location();
                addDiag(diag::UdpEdgeInComb, *loc);
            }
        }
        sawTransition = true;
    };

    auto nextSymbol = [&](bool required, bool insideTrans, bool& error) {
        switch (peek().kind) {
            case TokenKind::Question:
                return consume();
            case TokenKind::Star:
                if (!insideTrans)
                    checkTransition();
                return consume();
            case TokenKind::Minus: {
                auto tok = consume();
                if (isInput) {
                    error = true;
                    addDiag(diag::UdpInvalidMinus, tok.location());
                }
                return tok;
            }
            case TokenKind::Identifier:
            case TokenKind::IntegerLiteral: {
                auto tok = consume();
                auto text = tok.rawText();
                for (size_t i = 0; i < text.length(); i++) {
                    char c = charToLower(text[i]);
                    switch (c) {
                        case '0':
                        case '1':
                        case 'x':
                        case 'b':
                            break;
                        case 'r':
                        case 'f':
                        case 'p':
                        case 'n':
                            if (!insideTrans)
                                checkTransition(tok.location() + i);
                            break;
                        default:
                            error = true;
                            addDiag(diag::UdpInvalidSymbol, tok.location() + i) << c;
                            break;
                    }
                }
                return tok;
            }
            default:
                if (required) {
                    error = true;
                    addDiag(diag::ExpectedUdpSymbol, peek().location());
                }
                return Token();
        }
    };

    if (peek(TokenKind::OpenParenthesis)) {
        checkTransition();
        auto openParen = consume();

        bool error = false;
        auto first = nextSymbol(true, true, error);
        auto second = nextSymbol(false, true, error);
        auto closeParen = expect(TokenKind::CloseParenthesis);
        auto result = &factory.udpEdgeField(openParen, first, second, closeParen);

        if (!closeParen.isMissing()) {
            if (!isInput) {
                addDiag(diag::UdpInvalidTransition, result->sourceRange());
            }
            else if (!error) {
                if (first.rawText().size() + second.rawText().size() != 2) {
                    addDiag(diag::UdpTransitionLength, result->sourceRange());
                }
                else {
                    char chars[2] = {};
                    int idx = 0;
                    for (auto tok : {first, second}) {
                        auto text = tok.rawText();
                        for (size_t i = 0; i < text.length(); i++) {
                            char c = charToLower(text[i]);
                            switch (c) {
                                case '0':
                                case '1':
                                case 'x':
                                case 'b':
                                case '?':
                                    chars[idx++] = c;
                                    break;
                                default:
                                    addDiag(diag::UdpInvalidEdgeSymbol, tok.location() + i) << c;
                                    break;
                            }
                        }
                    }

                    if (idx == 2 && chars[0] == chars[1] && chars[0] != 'b' && chars[0] != '?')
                        addDiag(diag::UdpTransSameChar, result->sourceRange());
                }
            }
        }

        return result;
    }

    bool error = false;
    auto next = nextSymbol(required, false, error);
    if (!next)
        return nullptr;

    if (!isInput && !error) {
        auto text = next.rawText();
        if (text.length() > 1) {
            addDiag(diag::UdpSingleChar, next.range());
        }
        else if (!text.empty()) {
            char c = charToLower(text[0]);
            switch (c) {
                case '*':
                case 'r':
                case 'f':
                case 'p':
                case 'n':
                    addDiag(diag::UdpInvalidInputOnly, next.location()) << c;
                    break;
                default:
                    break;
            }
        }
    }

    return &factory.udpSimpleField(next);
}